

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

void cvui::render::window
               (cvui_block_t *theBlock,Rect *theTitleBar,Rect *theContent,String *theTitle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 local_140 [2];
  cvui_block_t *local_138;
  undefined8 local_130;
  Matx<double,_4,_1> local_128;
  undefined8 local_100;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Matx<double,_4,_1> local_b8;
  Mat aOverlay;
  
  cv::Mat::Mat(&aOverlay);
  local_130 = 0;
  local_140[0] = 0x3010000;
  local_c8._0_4_ = theTitleBar->x;
  local_c8._4_4_ = theTitleBar->y;
  uStack_c0._0_4_ = theTitleBar->width;
  uStack_c0._4_4_ = theTitleBar->height;
  local_138 = theBlock;
  cv::Matx<double,_4,_1>::Matx(&local_128);
  local_128.val[0] = 74.0;
  local_128.val[1] = 74.0;
  local_128.val[2] = 74.0;
  local_128.val[3] = 0.0;
  cv::rectangle(local_140,&local_c8,&local_128,1,8,0);
  local_d8 = theTitleBar->x + 1;
  iStack_d4 = theTitleBar->y + 1;
  iStack_d0 = theTitleBar->width + -2;
  iStack_cc = theTitleBar->height + -2;
  theTitleBar->x = local_d8;
  theTitleBar->y = iStack_d4;
  theTitleBar->width = iStack_d0;
  theTitleBar->height = iStack_cc;
  local_130 = 0;
  local_140[0] = 0x3010000;
  local_138 = theBlock;
  cv::Matx<double,_4,_1>::Matx(&local_128);
  local_128.val[0] = 33.0;
  local_128.val[1] = 33.0;
  local_128.val[2] = 33.0;
  local_128.val[3] = 0.0;
  cv::rectangle(local_140,&local_d8,&local_128,0xffffffffffffffff,8,0);
  local_128.val[2] = 0.0;
  local_128.val[0] = (double)CONCAT44(local_128.val[0]._4_4_,0x3010000);
  uVar1 = theTitleBar->x;
  uVar2 = theTitleBar->y;
  local_100 = CONCAT44(uVar2 + 0xc,uVar1 + 5);
  local_128.val[1] = (double)theBlock;
  cv::Matx<double,_4,_1>::Matx(&local_b8);
  local_b8.val[0] = 206.0;
  local_b8.val[1] = 206.0;
  local_b8.val[2] = 206.0;
  local_b8.val[3] = 0.0;
  cv::putText(0x3fd999999999999a,&local_128,theTitle,&local_100,0,&local_b8,1,0x10,0);
  local_130 = 0;
  local_140[0] = 0x3010000;
  local_e8._0_4_ = theContent->x;
  local_e8._4_4_ = theContent->y;
  uStack_e0._0_4_ = theContent->width;
  uStack_e0._4_4_ = theContent->height;
  local_138 = theBlock;
  cv::Matx<double,_4,_1>::Matx(&local_128);
  local_128.val[0] = 74.0;
  local_128.val[1] = 74.0;
  local_128.val[2] = 74.0;
  local_128.val[3] = 0.0;
  cv::rectangle(local_140,&local_e8,&local_128,1,8,0);
  local_f8 = theContent->x + 1;
  iStack_f4 = theContent->y + 1;
  iStack_f0 = theContent->width + -2;
  iStack_ec = theContent->height + -2;
  theContent->x = local_f8;
  theContent->y = iStack_f4;
  theContent->width = iStack_f0;
  theContent->height = iStack_ec;
  local_130 = 0;
  local_140[0] = 0x3010000;
  local_138 = theBlock;
  cv::Matx<double,_4,_1>::Matx(&local_128);
  local_128.val[0] = 49.0;
  local_128.val[1] = 49.0;
  local_128.val[2] = 49.0;
  local_128.val[3] = 0.0;
  cv::rectangle(local_140,&local_f8,&local_128,0xffffffffffffffff,8,0);
  cv::Mat::~Mat(&aOverlay);
  return;
}

Assistant:

void window(cvui_block_t& theBlock, cv::Rect& theTitleBar, cv::Rect& theContent, const cv::String& theTitle) {
		bool aTransparecy = false;
		double aAlpha = 0.3;
		cv::Mat aOverlay;

		// Render the title bar.
		// First the border
		cv::rectangle(theBlock.where, theTitleBar, cv::Scalar(0x4A, 0x4A, 0x4A));
		// then the inside
		theTitleBar.x++; theTitleBar.y++; theTitleBar.width -= 2; theTitleBar.height -= 2;
		cv::rectangle(theBlock.where, theTitleBar, cv::Scalar(0x21, 0x21, 0x21), CVUI_FILLED);

		// Render title text.
		cv::Point aPos(theTitleBar.x + 5, theTitleBar.y + 12);
		cv::putText(theBlock.where, theTitle, aPos, cv::FONT_HERSHEY_SIMPLEX, 0.4, cv::Scalar(0xCE, 0xCE, 0xCE), 1, CVUI_ANTIALISED);

		// Render the body.
		// First the border.
		cv::rectangle(theBlock.where, theContent, cv::Scalar(0x4A, 0x4A, 0x4A));

		// Then the filling.
		theContent.x++; theContent.y++; theContent.width -= 2; theContent.height -= 2;

		if (aTransparecy) {
			theBlock.where.copyTo(aOverlay);
			cv::rectangle(aOverlay, theContent, cv::Scalar(0x31, 0x31, 0x31), CVUI_FILLED);
			cv::addWeighted(aOverlay, aAlpha, theBlock.where, 1.0 - aAlpha, 0.0, theBlock.where);

		} else {
			cv::rectangle(theBlock.where, theContent, cv::Scalar(0x31, 0x31, 0x31), CVUI_FILLED);
		}
	}